

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

void spvtools::CFA<spvtools::val::BasicBlock>::DepthFirstTraversal
               (BasicBlock *entry,get_blocks_func *successor_func,
               function<void_(const_spvtools::val::BasicBlock_*)> *preorder,
               function<void_(const_spvtools::val::BasicBlock_*)> *postorder,
               function<bool_(const_spvtools::val::BasicBlock_*)> *terminal)

{
  function<bool_(const_spvtools::val::BasicBlock_*)> local_d0;
  function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)> local_b0;
  function<void_(const_spvtools::val::BasicBlock_*)> local_90;
  function<void_(const_spvtools::val::BasicBlock_*)> local_70;
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  local_50;
  function<bool_(const_spvtools::val::BasicBlock_*)> *local_30;
  function<bool_(const_spvtools::val::BasicBlock_*)> *terminal_local;
  function<void_(const_spvtools::val::BasicBlock_*)> *postorder_local;
  function<void_(const_spvtools::val::BasicBlock_*)> *preorder_local;
  get_blocks_func *successor_func_local;
  BasicBlock *entry_local;
  
  local_30 = terminal;
  terminal_local = (function<bool_(const_spvtools::val::BasicBlock_*)> *)postorder;
  postorder_local = preorder;
  preorder_local = (function<void_(const_spvtools::val::BasicBlock_*)> *)successor_func;
  successor_func_local = (get_blocks_func *)entry;
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::function(&local_50,successor_func);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::function(&local_70,preorder);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::function(&local_90,postorder);
  std::function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>::
  function(&local_b0);
  std::function<bool_(const_spvtools::val::BasicBlock_*)>::function(&local_d0,terminal);
  DepthFirstTraversal(entry,&local_50,&local_70,&local_90,&local_b0,&local_d0);
  std::function<bool_(const_spvtools::val::BasicBlock_*)>::~function(&local_d0);
  std::function<void_(const_spvtools::val::BasicBlock_*,_const_spvtools::val::BasicBlock_*)>::
  ~function(&local_b0);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_90);
  std::function<void_(const_spvtools::val::BasicBlock_*)>::~function(&local_70);
  std::
  function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
  ::~function(&local_50);
  return;
}

Assistant:

void CFA<BB>::DepthFirstTraversal(const BB* entry,
                                  get_blocks_func successor_func,
                                  std::function<void(cbb_ptr)> preorder,
                                  std::function<void(cbb_ptr)> postorder,
                                  std::function<bool(cbb_ptr)> terminal) {
  DepthFirstTraversal(entry, successor_func, preorder, postorder,
                      /* backedge = */ {}, terminal);
}